

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_timer.cpp
# Opt level: O0

double __thiscall lzham::lzham_timer::get_elapsed_secs(lzham_timer *this)

{
  long lVar1;
  long *in_RDI;
  undefined1 auVar2 [16];
  timer_ticks delta;
  timer_ticks stop_time;
  double local_8;
  
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    local_8 = 0.0;
  }
  else {
    lVar1 = in_RDI[1];
    if ((*(byte *)(in_RDI + 2) >> 1 & 1) == 0) {
      query_counter((timer_ticks *)0x12b298);
    }
    lVar1 = lVar1 - *in_RDI;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * g_inv_freq;
  }
  return local_8;
}

Assistant:

double lzham_timer::get_elapsed_secs() const
   {
      LZHAM_ASSERT(m_started);
      if (!m_started)
         return 0;
      
      timer_ticks stop_time = m_stop_time;
      if (!m_stopped)
         query_counter(&stop_time);
         
      timer_ticks delta = stop_time - m_start_time;
      return delta * g_inv_freq;
   }